

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
array<CCommandManager::CCommand,_allocator_default<CCommandManager::CCommand>_>::remove_index
          (array<CCommandManager::CCommand,_allocator_default<CCommandManager::CCommand>_> *this,
          int index)

{
  char *__dest;
  long lVar1;
  long lVar2;
  
  lVar1 = (long)index;
  lVar2 = lVar1 * 0xa0;
  while( true ) {
    lVar1 = lVar1 + 1;
    if (this->num_elements <= lVar1) break;
    __dest = this->list->m_aName + lVar2;
    memcpy(__dest,__dest + 0xa0,0xa0);
    lVar2 = lVar2 + 0xa0;
  }
  set_size(this,this->num_elements + -1);
  return;
}

Assistant:

void remove_index(int index)
	{
		for(int i = index+1; i < num_elements; i++)
			list[i-1] = list[i];

		set_size(size()-1);
	}